

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dtypes.h
# Opt level: O2

void __thiscall GroupInfo::GroupInfo(GroupInfo *this,GroupInfo *info)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  ulong uVar4;
  
  cVar1 = info->name_length;
  this->name_length = cVar1;
  this->id = info->id;
  this->name = (char *)0x0;
  this->next_offset = info->next_offset;
  cVar2 = info->descr_length;
  this->descr_length = cVar2;
  this->description = (char *)0x0;
  this->locked = info->locked;
  uVar4 = (long)cVar1 + 1;
  pcVar3 = (char *)operator_new__(uVar4);
  this->name = pcVar3;
  memcpy(pcVar3,info->name,uVar4);
  uVar4 = (long)cVar2 + 1;
  pcVar3 = (char *)operator_new__(uVar4);
  this->description = pcVar3;
  memcpy(pcVar3,info->description,uVar4);
  return;
}

Assistant:

GroupInfo(const GroupInfo &info) :
		name_length (info.name_length),
		id (info.id),
		name (NULL),
		next_offset (info.next_offset),
		descr_length (info.descr_length),
		description (NULL),
		locked (info.locked) {
			// we also need to copy the '\0' character at the end!
			name = new char[name_length + 1];
			memcpy (name, info.name, sizeof(char) * (name_length + 1));

			// we also need to copy the '\0' character at the end!
			description = new char[descr_length + 1];
			memcpy (description, info.description, sizeof(char) * (descr_length + 1));
		}